

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void PrepLWall(fixed_t *lwall,double walxrepeat,int x1,int x2)

{
  int32_t iVar1;
  fixed_t walxrepeat_00;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_54;
  int x;
  double botstep;
  double topstep;
  double xrepeat;
  double i;
  double bot;
  double top;
  int x2_local;
  int x1_local;
  double walxrepeat_local;
  fixed_t *lwall_local;
  
  dVar2 = ABS(walxrepeat * 65536.0);
  i = (double)WallT.InvZorg + (double)WallT.InvZstep * (double)(x1 - centerx);
  bot = dVar2 * ((double)WallT.UoverZorg + (double)WallT.UoverZstep * (double)(x1 - centerx));
  dVar3 = (double)WallT.UoverZstep;
  dVar4 = (double)WallT.InvZstep;
  for (local_54 = x1; local_54 < x2; local_54 = local_54 + 1) {
    if (0.0 <= walxrepeat) {
      iVar1 = xs_RoundToInt((real64)(bot / i));
      lwall[local_54] = iVar1;
    }
    else {
      iVar1 = xs_RoundToInt((real64)(dVar2 - bot / i));
      lwall[local_54] = iVar1;
    }
    bot = dVar3 * dVar2 + bot;
    i = dVar4 + i;
  }
  walxrepeat_00 = FloatToFixed(walxrepeat);
  PrepWallRoundFix(lwall,walxrepeat_00,x1,x2);
  return;
}

Assistant:

void PrepLWall (fixed_t *lwall, double walxrepeat, int x1, int x2)
{ // lwall = texturecolumn
	double top, bot, i;
	double xrepeat = fabs(walxrepeat * 65536);
	double topstep, botstep;

	i = x1 - centerx;
	top = WallT.UoverZorg + WallT.UoverZstep * i;
	bot = WallT.InvZorg + WallT.InvZstep * i;

	top *= xrepeat;
	topstep = WallT.UoverZstep * xrepeat;
	botstep = WallT.InvZstep;

	for (int x = x1; x < x2; x++)
	{
		if (walxrepeat < 0)
		{
			lwall[x] = xs_RoundToInt(xrepeat - top / bot);
		}
		else
		{
			lwall[x] = xs_RoundToInt(top / bot);
		}
		top += topstep;
		bot += botstep;
	}
	PrepWallRoundFix(lwall, FLOAT2FIXED(walxrepeat), x1, x2);
}